

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-version.c
# Opt level: O0

void test_bson_version(void)

{
  FILE *pFVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  undefined8 uVar6;
  
  iVar3 = bson_get_major_version();
  pFVar1 = _stderr;
  if (iVar3 != 1) {
    uVar4 = bson_get_major_version();
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)uVar4,"==",1,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-version.c"
            ,8,"test_bson_version");
    abort();
  }
  iVar3 = bson_get_minor_version();
  pFVar1 = _stderr;
  if (iVar3 != 10) {
    uVar4 = bson_get_minor_version();
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)uVar4,"==",10,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-version.c"
            ,9,"test_bson_version");
    abort();
  }
  iVar3 = bson_get_micro_version();
  pFVar1 = _stderr;
  if (iVar3 != 0) {
    uVar4 = bson_get_micro_version();
    fprintf(pFVar1,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)uVar4,"==",0,
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-version.c"
            ,10,"test_bson_version");
    abort();
  }
  pcVar5 = (char *)bson_get_version();
  if (pcVar5 != "1.10.0-dev") {
    pcVar5 = (char *)bson_get_version();
    iVar3 = strcmp(pcVar5,"1.10.0-dev");
    pFVar1 = _stderr;
    if (iVar3 != 0) {
      uVar6 = bson_get_version();
      fprintf(pFVar1,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",uVar6,"1.10.0-dev");
      abort();
    }
  }
  bVar2 = bson_check_version(1,10,0);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-version.c"
            ,0xe,"test_bson_version",
            "bson_check_version ( BSON_MAJOR_VERSION, BSON_MINOR_VERSION, BSON_MICRO_VERSION)");
    abort();
  }
  bVar2 = bson_check_version(1,0xb,0);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-version.c"
            ,0x11,"test_bson_version",
            "!bson_check_version ( BSON_MAJOR_VERSION, BSON_MINOR_VERSION + 1, BSON_MICRO_VERSION)")
    ;
    abort();
  }
  return;
}

Assistant:

static void
test_bson_version (void)
{
   ASSERT_CMPINT (bson_get_major_version (), ==, BSON_MAJOR_VERSION);
   ASSERT_CMPINT (bson_get_minor_version (), ==, BSON_MINOR_VERSION);
   ASSERT_CMPINT (bson_get_micro_version (), ==, BSON_MICRO_VERSION);
   ASSERT_CMPSTR (bson_get_version (), BSON_VERSION_S);

   ASSERT (bson_check_version (
      BSON_MAJOR_VERSION, BSON_MINOR_VERSION, BSON_MICRO_VERSION));

   ASSERT (!bson_check_version (
      BSON_MAJOR_VERSION, BSON_MINOR_VERSION + 1, BSON_MICRO_VERSION));
}